

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

recursive_directory_iterator * __thiscall
ghc::filesystem::recursive_directory_iterator::increment
          (recursive_directory_iterator *this,error_code *ec)

{
  bool bVar1;
  bool bVar2;
  directory_options X;
  EnableBitmask<ghc::filesystem::directory_options> EVar3;
  int iVar4;
  directory_entry *pdVar5;
  path *p;
  element_type *peVar6;
  element_type *peVar7;
  reference pvVar8;
  bool local_c5;
  directory_iterator local_70;
  directory_iterator local_60;
  byte local_49;
  file_status local_48;
  byte local_3d;
  file_status local_3c;
  undefined1 local_34 [8];
  file_status symlink_status;
  file_status status;
  error_code *ec_local;
  recursive_directory_iterator *this_local;
  
  pdVar5 = operator->(this);
  directory_entry::status((directory_entry *)&symlink_status._perms,(error_code *)pdVar5);
  bVar1 = std::error_code::operator_cast_to_bool(ec);
  if (bVar1) {
    symlink_status._type = not_found;
  }
  else {
    pdVar5 = operator->(this);
    directory_entry::symlink_status((directory_entry *)local_34,(error_code *)pdVar5);
    bVar1 = std::error_code::operator_cast_to_bool(ec);
    if (!bVar1) {
      bVar2 = recursion_pending(this);
      local_3d = 0;
      local_49 = 0;
      bVar1 = false;
      if (bVar2) {
        file_status::file_status(&local_3c,(file_status *)&symlink_status._perms);
        local_3d = 1;
        bVar2 = is_directory(&local_3c);
        bVar1 = false;
        if (bVar2) {
          file_status::file_status(&local_48,(file_status *)local_34);
          local_49 = 1;
          bVar2 = is_symlink(&local_48);
          bVar1 = true;
          if (bVar2) {
            X = options(this);
            EVar3 = operator&(X,follow_directory_symlink);
            bVar1 = EVar3 != none;
          }
        }
      }
      if ((local_49 & 1) != 0) {
        file_status::~file_status(&local_48);
      }
      if ((local_3d & 1) != 0) {
        file_status::~file_status(&local_3c);
      }
      if (bVar1) {
        peVar7 = std::
                 __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pdVar5 = operator->(this);
        p = directory_entry::path(pdVar5);
        peVar6 = std::
                 __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        directory_iterator::directory_iterator(&local_60,p,peVar6->_options,ec);
        std::
        stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
        ::push(&peVar7->_dir_iter_stack,&local_60);
        directory_iterator::~directory_iterator(&local_60);
      }
      else {
        peVar7 = std::
                 __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        pvVar8 = std::
                 stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
                 ::top(&peVar7->_dir_iter_stack);
        directory_iterator::increment(pvVar8,ec);
      }
      bVar1 = std::error_code::operator_cast_to_bool(ec);
      if (bVar1) {
        peVar7 = std::
                 __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this);
        bVar1 = std::
                stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
                ::empty(&peVar7->_dir_iter_stack);
        if (!bVar1) {
          peVar7 = std::
                   __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          std::
          stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
          ::pop(&peVar7->_dir_iter_stack);
        }
      }
      else {
        while( true ) {
          iVar4 = depth(this);
          local_c5 = false;
          if (iVar4 != 0) {
            peVar7 = std::
                     __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this);
            pvVar8 = std::
                     stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
                     ::top(&peVar7->_dir_iter_stack);
            directory_iterator::directory_iterator(&local_70);
            local_c5 = directory_iterator::operator==(pvVar8,&local_70);
            directory_iterator::~directory_iterator(&local_70);
          }
          if (local_c5 == false) break;
          peVar7 = std::
                   __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          std::
          stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
          ::pop(&peVar7->_dir_iter_stack);
          peVar7 = std::
                   __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)this);
          pvVar8 = std::
                   stack<ghc::filesystem::directory_iterator,_std::deque<ghc::filesystem::directory_iterator,_std::allocator<ghc::filesystem::directory_iterator>_>_>
                   ::top(&peVar7->_dir_iter_stack);
          directory_iterator::increment(pvVar8,ec);
        }
      }
      peVar7 = std::
               __shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ghc::filesystem::recursive_directory_iterator::recursive_directory_iterator_impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar7->_recursion_pending = true;
    }
    symlink_status._type = not_found;
    file_status::~file_status((file_status *)local_34);
  }
  file_status::~file_status((file_status *)&symlink_status._perms);
  return this;
}

Assistant:

GHC_INLINE recursive_directory_iterator& recursive_directory_iterator::increment(std::error_code& ec) noexcept
{
    auto status = (*this)->status(ec);
    if (ec) return *this;
    auto symlink_status = (*this)->symlink_status(ec);
    if (ec) return *this;
    if (recursion_pending() && is_directory(status) && (!is_symlink(symlink_status) || (options() & directory_options::follow_directory_symlink) != directory_options::none)) {
        _impl->_dir_iter_stack.push(directory_iterator((*this)->path(), _impl->_options, ec));
    }
    else {
        _impl->_dir_iter_stack.top().increment(ec);
    }
    if (!ec) {
        while (depth() && _impl->_dir_iter_stack.top() == directory_iterator()) {
            _impl->_dir_iter_stack.pop();
            _impl->_dir_iter_stack.top().increment(ec);
        }
    }
    else if (!_impl->_dir_iter_stack.empty()) {
        _impl->_dir_iter_stack.pop();
    }
    _impl->_recursion_pending = true;
    return *this;
}